

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O2

ArrayFeatureType_ShapeRange * __thiscall
CoreML::Specification::ArrayFeatureType::mutable_shaperange(ArrayFeatureType *this)

{
  ArrayFeatureType_EnumeratedShapes *this_00;
  
  if (this->_oneof_case_[0] == 0x1f) {
    this_00 = (this->ShapeFlexibility_).enumeratedshapes_;
  }
  else {
    clear_ShapeFlexibility(this);
    this->_oneof_case_[0] = 0x1f;
    this_00 = (ArrayFeatureType_EnumeratedShapes *)operator_new(0x30);
    ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange((ArrayFeatureType_ShapeRange *)this_00)
    ;
    (this->ShapeFlexibility_).shaperange_ = (ArrayFeatureType_ShapeRange *)this_00;
  }
  return (ArrayFeatureType_ShapeRange *)this_00;
}

Assistant:

inline ::CoreML::Specification::ArrayFeatureType_ShapeRange* ArrayFeatureType::mutable_shaperange() {
  if (!has_shaperange()) {
    clear_ShapeFlexibility();
    set_has_shaperange();
    ShapeFlexibility_.shaperange_ = new ::CoreML::Specification::ArrayFeatureType_ShapeRange;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ArrayFeatureType.shapeRange)
  return ShapeFlexibility_.shaperange_;
}